

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfMw.c
# Opt level: O1

sbfMw sbfMw_create(sbfLog log,sbfKeyValue properties)

{
  void *__arg;
  u_int uVar1;
  int iVar2;
  long lVar3;
  char *__nptr;
  sbfMw psVar4;
  sbfKeyValue psVar5;
  sbfMwThread psVar6;
  undefined8 uVar7;
  long lVar8;
  uint64_t uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  
  if (sbfMw_checkSupported_processed == '\0') {
    lVar3 = sbfPerfCounter_frequency();
    uVar9 = 1;
    if (lVar3 == 0) {
      uVar9 = sbfMw_checkSupported::supported;
    }
    sbfMw_checkSupported_processed = '\x01';
    sbfMw_checkSupported::supported = uVar9;
  }
  __nptr = (char *)sbfKeyValue_get(properties,"threads");
  if (__nptr == (char *)0x0) {
    uVar1 = 1;
  }
  else {
    uVar1 = atoi(__nptr);
  }
  if (uVar1 - 0x41 < 0xffffffc0) {
    psVar4 = (sbfMw)0x0;
  }
  else {
    signal(0xd,(__sighandler_t)0x1);
    psVar4 = (sbfMw)sbfMemory_calloc(1,0x20);
    psVar5 = (sbfKeyValue)sbfKeyValue_copy(properties);
    psVar4->mProperties = psVar5;
    psVar4->mLog = log;
    psVar4->mNumThreads = uVar1;
    psVar6 = (sbfMwThread)sbfMemory_calloc(uVar1,0xa0);
    psVar4->mThreads = psVar6;
    sbfLog_log(psVar4->mLog,1,"this is version 0.0.2");
    sbfLog_log(psVar4->mLog,0,"creating middleware %p, using %u threads",psVar4,uVar1);
    iVar2 = evthread_use_pthreads();
    if (iVar2 != 0) {
LAB_001031d8:
      uVar10 = 0x104173;
      sbfFatal_die();
      if (sbfMw_checkSupported_processed == '\0') {
        lVar3 = sbfPerfCounter_frequency();
        uVar9 = 1;
        if (lVar3 == 0) {
          uVar9 = sbfMw_checkSupported::supported;
        }
        sbfMw_checkSupported_processed = '\x01';
        sbfMw_checkSupported::supported = uVar9;
      }
      uVar10 = uVar10 & (uint)sbfMw_checkSupported::supported;
      return (sbfMw)(ulong)uVar10;
    }
    uVar7 = event_config_new();
    event_config_set_flag(uVar7,0x10);
    if (psVar4->mNumThreads != 0) {
      lVar3 = 0;
      uVar11 = 0;
      do {
        psVar6 = psVar4->mThreads;
        *(sbfMw *)((long)&psVar6->mParent + lVar3) = psVar4;
        *(int *)((long)&psVar6->mIndex + lVar3) = (int)uVar11;
        lVar8 = event_base_new_with_config(uVar7);
        *(long *)((long)&psVar6->mEventBase + lVar3) = lVar8;
        if (lVar8 == 0) {
          sbfFatal_die("event_base_new failed");
LAB_001031cc:
          sbfFatal_die("sbfThread_create failed");
          goto LAB_001031d8;
        }
        __arg = (void *)((long)&psVar6->mParent + lVar3);
        lVar12 = (long)&(psVar6->mTimer).ev_evcallback.evcb_active_next.tqe_next + lVar3;
        event_assign(lVar12,lVar8,0xffffffff,0,sbfMwEventBaseTimerCb,__arg);
        event_add(lVar12);
        iVar2 = pthread_create((pthread_t *)((long)&psVar6->mThread + lVar3),(pthread_attr_t *)0x0,
                               sbfMwEventBaseThreadCb,__arg);
        if (iVar2 != 0) goto LAB_001031cc;
        uVar11 = uVar11 + 1;
        lVar3 = lVar3 + 0xa0;
      } while (uVar11 < psVar4->mNumThreads);
    }
    event_config_free(uVar7);
  }
  return psVar4;
}

Assistant:

sbfMw
sbfMw_create (sbfLog log, sbfKeyValue properties)
{
    sbfMw                mw;
    const char*          value;
    int                  threads;
    u_int                i;
    sbfMwThread          thread;
    struct event_config* ec;
#ifdef WIN32
    WSADATA              wsd;
#endif

    // Check all the supported capabilities
    sbfMw_checkSupported (CAP_ALL_MASK);
    
    value = sbfKeyValue_get (properties, "threads");
    if (value == NULL)
        threads = 1;
    else
        threads = atoi (value);
    if (threads <= 0 || threads > SBF_MW_THREAD_LIMIT)
        return NULL;

#ifndef WIN32
    signal (SIGPIPE, SIG_IGN);
#endif

    mw = xcalloc (1, sizeof *mw);
    mw->mProperties = sbfKeyValue_copy (properties);
    mw->mLog = log;
    mw->mNumThreads = threads;
    mw->mThreads = xcalloc (mw->mNumThreads, sizeof *mw->mThreads);

    sbfLog_info (mw->mLog, "this is version " SBF_VERSION);
    sbfLog_debug (mw->mLog,
                  "creating middleware %p, using %u threads",
                  mw,
                  threads);

#ifdef WIN32
    if (WSAStartup (MAKEWORD (2, 2), &wsd) != 0)
        SBF_FATAL ("WSAStartup failed");
    if (evthread_use_windows_threads () != 0)
        SBF_FATAL ("event_use_windows_threads failed");
#else
    if (evthread_use_pthreads () != 0)
        SBF_FATAL ("event_use_pthreads failed");
#endif

    ec = event_config_new ();
    event_config_set_flag (ec, EVENT_BASE_FLAG_EPOLL_USE_CHANGELIST);

    for (i = 0; i < mw->mNumThreads; i++)
    {
        thread = &mw->mThreads[i];
        thread->mParent = mw;
        thread->mIndex = i;

        thread->mEventBase = event_base_new_with_config (ec);
        if (thread->mEventBase == NULL)
            SBF_FATAL ("event_base_new failed");

        event_assign (&thread->mTimer,
                      thread->mEventBase,
                      -1,
                      0,
                      sbfMwEventBaseTimerCb,
                      thread);
        sbfMwEventBaseTimerCb (-1, 0, thread);

        if (sbfThread_create (&thread->mThread,
                              sbfMwEventBaseThreadCb,
                              thread) != 0)
            SBF_FATAL ("sbfThread_create failed");
    }

    event_config_free (ec);
    return mw;
}